

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.cpp
# Opt level: O1

void __thiscall
OptionParser::parseReportField(OptionParser *this,Network *network,int nTokens,string *tokens)

{
  string *s1;
  pointer pcVar1;
  bool bVar2;
  int index;
  InputError *pIVar3;
  int enabled;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  double local_70;
  double lowerLimit;
  double upperLimit;
  int local_58;
  int local_54;
  int precision;
  char local_40 [16];
  
  local_58 = -1;
  local_70 = -1.0;
  lowerLimit = -1.0;
  upperLimit._4_4_ = nTokens;
  index = Utilities::findMatch(tokens,ReportFields::NodeFieldNames);
  if (index < 0) {
    index = Utilities::findMatch(tokens,ReportFields::LinkFieldNames);
    if (index < 0) {
      pIVar3 = (InputError *)__cxa_allocate_exception(0x30);
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      pcVar1 = (tokens->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_110,pcVar1,pcVar1 + tokens->_M_string_length);
      InputError::InputError(pIVar3,3,&local_110);
      __cxa_throw(pIVar3,&InputError::typeinfo,ENerror::~ENerror);
    }
    local_54 = 1;
  }
  else {
    local_54 = 0;
  }
  _precision = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&precision,"YES","");
  s1 = tokens + 1;
  bVar2 = Utilities::match(s1,(string *)&precision);
  if (_precision != local_40) {
    operator_delete(_precision);
  }
  enabled = 1;
  if (!bVar2) {
    _precision = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)&precision,"NO","");
    bVar2 = Utilities::match(s1,(string *)&precision);
    if (_precision != local_40) {
      operator_delete(_precision);
    }
    enabled = 0;
    if (!bVar2) {
      if (upperLimit._4_4_ < 3) {
        return;
      }
      _precision = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)&precision,"PRECISION","");
      bVar2 = Utilities::match(s1,(string *)&precision);
      if (_precision != local_40) {
        operator_delete(_precision);
      }
      if (bVar2) {
        bVar2 = Utilities::parseNumber<int>(tokens + 2,&local_58);
        enabled = -1;
        if (!bVar2) {
          pIVar3 = (InputError *)__cxa_allocate_exception(0x30);
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          pcVar1 = tokens[2]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_f0,pcVar1,pcVar1 + tokens[2]._M_string_length);
          InputError::InputError(pIVar3,6,&local_f0);
          __cxa_throw(pIVar3,&InputError::typeinfo,ENerror::~ENerror);
        }
      }
      else {
        _precision = local_40;
        std::__cxx11::string::_M_construct<char_const*>((string *)&precision,"BELOW","");
        bVar2 = Utilities::match(s1,(string *)&precision);
        if (_precision != local_40) {
          operator_delete(_precision);
        }
        if (bVar2) {
          bVar2 = Utilities::parseNumber<double>(tokens + 2,&local_70);
          enabled = -1;
          if (!bVar2) {
            pIVar3 = (InputError *)__cxa_allocate_exception(0x30);
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            pcVar1 = tokens[2]._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_d0,pcVar1,pcVar1 + tokens[2]._M_string_length);
            InputError::InputError(pIVar3,6,&local_d0);
            __cxa_throw(pIVar3,&InputError::typeinfo,ENerror::~ENerror);
          }
        }
        else {
          _precision = local_40;
          std::__cxx11::string::_M_construct<char_const*>((string *)&precision,"ABOVE","");
          bVar2 = Utilities::match(s1,(string *)&precision);
          if (_precision != local_40) {
            operator_delete(_precision);
          }
          if (!bVar2) {
            pIVar3 = (InputError *)__cxa_allocate_exception(0x30);
            local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
            pcVar1 = tokens[1]._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_90,pcVar1,pcVar1 + tokens[1]._M_string_length);
            InputError::InputError(pIVar3,3,&local_90);
            __cxa_throw(pIVar3,&InputError::typeinfo,ENerror::~ENerror);
          }
          bVar2 = Utilities::parseNumber<double>(tokens + 2,&lowerLimit);
          enabled = -1;
          if (!bVar2) {
            pIVar3 = (InputError *)__cxa_allocate_exception(0x30);
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
            pcVar1 = tokens[2]._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_b0,pcVar1,pcVar1 + tokens[2]._M_string_length);
            InputError::InputError(pIVar3,6,&local_b0);
            __cxa_throw(pIVar3,&InputError::typeinfo,ENerror::~ENerror);
          }
        }
      }
    }
  }
  Options::setReportFieldOption
            (&network->options,local_54,index,enabled,local_58,local_70,lowerLimit);
  return;
}

Assistant:

void OptionParser::parseReportField(Network* network, int nTokens, string* tokens)
{
    int    type = Element::NODE;
    int    index = -1;
    int    enabled = -1;
    int    precision = -1;
    double lowerLimit = -1;
    double upperLimit = -1;

    // ... parse FieldName  YES/NO
    index = Utilities::findMatch(tokens[0], ReportFields::NodeFieldNames);
    if ( index < 0 )
    {
        type = Element::LINK;
        index = Utilities::findMatch(tokens[0], ReportFields::LinkFieldNames);
        if ( index < 0 ) throw InputError(InputError::INVALID_KEYWORD, tokens[0]);
    }

    if ( Utilities::match(tokens[1], "YES") ) enabled = 1;
    else if ( Utilities::match(tokens[1], "NO") ) enabled = 0;
    else if ( nTokens < 3 ) return;

    // ... parse FieldName  PRECISION  number
    else if ( Utilities::match(tokens[1], "PRECISION") )
    {
        if ( !Utilities::parseNumber(tokens[2], precision) )
        {
            throw InputError(InputError::INVALID_NUMBER, tokens[2]);
        }
    }

    // ... parse FieldName  ABOVE/BELOW  number
    else if ( Utilities::match(tokens[1], "BELOW") )
    {
        if ( !Utilities::parseNumber(tokens[2], lowerLimit) )
        {
            throw InputError(InputError::INVALID_NUMBER, tokens[2]);
        }
    }
    else if ( Utilities::match(tokens[1], "ABOVE") )
    {
        if ( !Utilities::parseNumber(tokens[2], upperLimit) )
        {
            throw InputError(InputError::INVALID_NUMBER, tokens[2]);
        }
    }
    else throw InputError(InputError::INVALID_KEYWORD, tokens[1]);

    network->options.setReportFieldOption(
            type, index, enabled, precision, lowerLimit, upperLimit);
}